

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O0

xmlTextWriterPtr xmlNewTextWriterDoc(xmlDocPtr *doc,int compression)

{
  xmlParserCtxtPtr ctxt_00;
  xmlDocPtr pxVar1;
  xmlParserCtxtPtr ctxt;
  xmlSAXHandler saxHandler;
  xmlTextWriterPtr ret;
  int compression_local;
  xmlDocPtr *doc_local;
  
  memset(&ctxt,0,0x100);
  xmlSAX2InitDefaultSAXHandler((xmlSAXHandler *)&ctxt,1);
  saxHandler.setDocumentLocator = xmlTextWriterStartDocumentCallback;
  ctxt_00 = xmlCreatePushParserCtxt((xmlSAXHandlerPtr)&ctxt,(void *)0x0,(char *)0x0,0,(char *)0x0);
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                    "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
    doc_local = (xmlDocPtr *)0x0;
  }
  else {
    ctxt_00->dictNames = 0;
    pxVar1 = xmlNewDoc("1.0");
    ctxt_00->myDoc = pxVar1;
    if (ctxt_00->myDoc == (xmlDocPtr)0x0) {
      xmlFreeParserCtxt(ctxt_00);
      xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                      "xmlNewTextWriterDoc : error at xmlNewDoc!\n");
      doc_local = (xmlDocPtr *)0x0;
    }
    else {
      saxHandler.serror = (xmlStructuredErrorFunc)xmlNewTextWriterPushParser(ctxt_00,compression);
      if ((xmlTextWriterPtr)saxHandler.serror == (xmlTextWriterPtr)0x0) {
        xmlFreeDoc(ctxt_00->myDoc);
        xmlFreeParserCtxt(ctxt_00);
        xmlWriterErrMsg((xmlTextWriterPtr)0x0,XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        doc_local = (xmlDocPtr *)0x0;
      }
      else {
        xmlSetDocCompressMode(ctxt_00->myDoc,compression);
        if (doc != (xmlDocPtr *)0x0) {
          *doc = ctxt_00->myDoc;
          *(undefined4 *)(saxHandler.serror + 0x40) = 1;
        }
        doc_local = (xmlDocPtr *)saxHandler.serror;
      }
    }
  }
  return (xmlTextWriterPtr)doc_local;
}

Assistant:

xmlTextWriterPtr
xmlNewTextWriterDoc(xmlDocPtr * doc, int compression)
{
    xmlTextWriterPtr ret;
    xmlSAXHandler saxHandler;
    xmlParserCtxtPtr ctxt;

    memset(&saxHandler, '\0', sizeof(saxHandler));
    xmlSAX2InitDefaultSAXHandler(&saxHandler, 1);
    saxHandler.startDocument = xmlTextWriterStartDocumentCallback;

    ctxt = xmlCreatePushParserCtxt(&saxHandler, NULL, NULL, 0, NULL);
    if (ctxt == NULL) {
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                "xmlNewTextWriterDoc : error at xmlCreatePushParserCtxt!\n");
        return NULL;
    }
    /*
     * For some reason this seems to completely break if node names
     * are interned.
     */
    ctxt->dictNames = 0;

    ctxt->myDoc = xmlNewDoc(BAD_CAST XML_DEFAULT_VERSION);
    if (ctxt->myDoc == NULL) {
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                        "xmlNewTextWriterDoc : error at xmlNewDoc!\n");
        return NULL;
    }

    ret = xmlNewTextWriterPushParser(ctxt, compression);
    if (ret == NULL) {
        xmlFreeDoc(ctxt->myDoc);
        xmlFreeParserCtxt(ctxt);
        xmlWriterErrMsg(NULL, XML_ERR_INTERNAL_ERROR,
                "xmlNewTextWriterDoc : error at xmlNewTextWriterPushParser!\n");
        return NULL;
    }

    xmlSetDocCompressMode(ctxt->myDoc, compression);

    if (doc != NULL) {
        *doc = ctxt->myDoc;
	ret->no_doc_free = 1;
    }

    return ret;
}